

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

void __thiscall
Exttpose::sort_get_l2
          (Exttpose *this,int *l2cnt,fstream *file,ofstream *ofd,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *cntary,bool use_seq)

{
  unsigned_long flen;
  ulong uVar1;
  runtime_error *this_00;
  reference pvVar2;
  byte *pbVar3;
  bool bVar4;
  unsigned_long numel;
  unsigned_long filesize;
  int *sortary;
  value_type local_50;
  int itbuf [3];
  int lit;
  int fcnt;
  int k;
  int j;
  int i;
  bool use_seq_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *cntary_local;
  ofstream *ofd_local;
  fstream *file_local;
  int *l2cnt_local;
  Exttpose *this_local;
  
  flen = file_size(file);
  if (flen != 0) {
    filesize = (unsigned_long)read_file(file,flen);
    uVar1 = std::ios::operator!(file + *(long *)(*(long *)file + -0x18));
    if ((uVar1 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error reading file.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    qsort((void *)filesize,flen >> 3,8,cmp2it);
  }
  k = 0;
  itbuf[2] = 0;
  for (fcnt = 0; (ulong)(long)fcnt < this->numfreq; fcnt = fcnt + 1) {
    if (this->args->use_seq == 0) {
      lit = fcnt + 1;
    }
    else {
      lit = 0;
    }
    for (; (ulong)(long)lit < this->numfreq; lit = lit + 1) {
      itbuf[2] = 0;
      if ((flen != 0) && ((ulong)(long)k < flen / 4)) {
        while( true ) {
          bVar4 = false;
          if ((ulong)(long)k < flen / 4) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->freqidx,(long)*(int *)(filesize + (long)k * 4));
            bVar4 = false;
            if (fcnt == *pvVar2) {
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->freqidx,(long)*(int *)(filesize + (long)(k + 1) * 4));
              bVar4 = lit == *pvVar2;
            }
          }
          if (!bVar4) break;
          itbuf[2] = itbuf[2] + 0x100;
          k = k + 2;
        }
      }
      if (this->args->use_seq == 0) {
        itbuf[1] = fcnt;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->offsets,(long)fcnt);
        itbuf[1] = (*pvVar2 - itbuf[1]) + -1;
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (cntary,(long)(itbuf[1] + lit));
        itbuf[2] = (uint)*pbVar3 + itbuf[2];
      }
      else {
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (cntary,(long)fcnt * this->numfreq + (long)lit);
        itbuf[2] = (uint)*pbVar3 + itbuf[2];
      }
      if (this->args->MINSUPPORT <= (long)itbuf[2]) {
        if (this->args->write_only_fcnt == 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->backidx,(long)fcnt);
          sortary._4_4_ = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->backidx,(long)lit);
          local_50 = *pvVar2;
          itbuf[0] = itbuf[2];
          std::ostream::write((char *)ofd,(long)&sortary + 4);
        }
        else {
          std::ostream::write((char *)ofd,(long)(itbuf + 2));
        }
        *l2cnt = *l2cnt + 1;
      }
    }
  }
  if ((flen != 0) && (filesize != 0)) {
    operator_delete__((void *)filesize);
  }
  return;
}

Assistant:

void Exttpose::sort_get_l2(int &l2cnt, fstream &file, ofstream &ofd, vector<unsigned char> &cntary, bool use_seq) {
    //write 2-itemsets counts to file

    int i, j, k;
    int fcnt;
    int lit;
    int itbuf[3];
    int *sortary;

    unsigned long filesize = file_size(file);

    if (filesize > 0) {
        sortary = read_file(file, filesize);

        if (!file) {
            throw runtime_error("Error reading file.");
        }
        qsort(sortary, (filesize / sizeof(int)) / 2, 2 * INT_SIZE, cmp2it);
    }

    unsigned long numel = filesize / INT_SIZE;
    i = 0;
    fcnt = 0;
    for (j = 0; j < numfreq; j++) {
        if (args.use_seq) k = 0;
        else k = j + 1;
        for (; k < numfreq; k++) {
            fcnt = 0;
            if (filesize > 0 && i < numel) {
                while (i < numel &&
                       j == freqidx[sortary[i]] && k == freqidx[sortary[i + 1]]) {
                    fcnt += 256;
                    i += 2;
                }
            }
            if (args.use_seq) fcnt += (int) cntary[j * numfreq + k];
            else {
                lit = j;
                lit = (offsets[lit] - lit - 1);
                fcnt += (int) cntary[lit + k];
            }

            if (fcnt >= args.MINSUPPORT) {
                if (args.write_only_fcnt) {
                    ofd.write((char *) &fcnt, INT_SIZE);
                } else {
                    itbuf[0] = backidx[j];
                    itbuf[1] = backidx[k];
                    itbuf[2] = fcnt;
                    ofd.write((char *) itbuf, 3 * sizeof(int));
                }
                l2cnt++;
            }
        }
    }
    if (filesize > 0) delete[] sortary;
}